

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagesetupdialog.cpp
# Opt level: O2

void __thiscall
QPageSetupDialogPrivate::setPrinter(QPageSetupDialogPrivate *this,QPrinter *newPrinter)

{
  OutputFormat OVar1;
  long in_FS_OFFSET;
  bool bVar2;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->printer != (QPrinter *)0x0) && (this->ownsPrinter == true)) {
    (**(code **)(*(long *)this->printer + 8))();
  }
  bVar2 = newPrinter == (QPrinter *)0x0;
  if (bVar2) {
    newPrinter = (QPrinter *)operator_new(0x20);
    QPrinter::QPrinter(newPrinter,ScreenResolution);
  }
  this->printer = newPrinter;
  this->ownsPrinter = bVar2;
  OVar1 = QPrinter::outputFormat(newPrinter);
  if (OVar1 != NativeFormat) {
    local_38[0] = '\x02';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[0x14] = '\0';
    local_38[0x15] = '\0';
    local_38[0x16] = '\0';
    local_38[0x17] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    local_38[8] = '\0';
    local_38[9] = '\0';
    local_38[10] = '\0';
    local_38[0xb] = '\0';
    local_38[0xc] = '\0';
    local_38[0xd] = '\0';
    local_38[0xe] = '\0';
    local_38[0xf] = '\0';
    local_38[0x10] = '\0';
    local_38[0x11] = '\0';
    local_38[0x12] = '\0';
    local_38[0x13] = '\0';
    local_20 = "default";
    QMessageLogger::warning(local_38,"QPageSetupDialog: Cannot be used on non-native printers");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPageSetupDialogPrivate::setPrinter(QPrinter *newPrinter)
{
    if (printer && ownsPrinter)
        delete printer;

    if (newPrinter) {
        printer = newPrinter;
        ownsPrinter = false;
    } else {
        printer = new QPrinter;
        ownsPrinter = true;
    }
    if (printer->outputFormat() != QPrinter::NativeFormat)
        qWarning("QPageSetupDialog: Cannot be used on non-native printers");
}